

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O0

void __thiscall
gl4cts::KHRDebug::ReceiveingMessagesTest::inspectDebugState
          (ReceiveingMessagesTest *this,GLboolean expected_state,GLDEBUGPROC expected_callback,
          GLvoid *expected_user_info)

{
  GLenum GVar1;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar2;
  TestError *pTVar3;
  void *local_1d0;
  GLvoid *callback_user_info;
  GLvoid *callback_procedure;
  MessageBuilder local_1b0;
  GLboolean local_29;
  GLvoid *pGStack_28;
  GLboolean debug_state;
  GLvoid *expected_user_info_local;
  GLDEBUGPROC expected_callback_local;
  ReceiveingMessagesTest *pRStack_10;
  GLboolean expected_state_local;
  ReceiveingMessagesTest *this_local;
  
  local_29 = 0xff;
  pGStack_28 = expected_user_info;
  expected_user_info_local = expected_callback;
  expected_callback_local._7_1_ = expected_state;
  pRStack_10 = this;
  (*((this->super_TestBase).m_gl)->getBooleanv)(0x92e0,&local_29);
  GVar1 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar1,"GetBooleanv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x710);
  if (expected_callback_local._7_1_ != local_29) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [24])"State of DEBUG_OUTPUT: ");
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_29);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [12])0x2c16365);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uchar *)((long)&expected_callback_local + 7));
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Invalid state of DEBUG_OUTPUT",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x717);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  callback_user_info = (GLvoid *)0x0;
  (*((this->super_TestBase).m_gl)->getPointerv)(0x8244,&callback_user_info);
  GVar1 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar1,"GetPointerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x71c);
  if (expected_user_info_local != callback_user_info) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Invalid state of DEBUG_CALLBACK_FUNCTION",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x720);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_1d0 = (GLvoid *)0x0;
  (*((this->super_TestBase).m_gl)->getPointerv)(0x8245,&local_1d0);
  GVar1 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar1,"GetPointerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x725);
  if (pGStack_28 != local_1d0) {
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Invalid state of DEBUG_CALLBACK_USER_PARAM",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x729);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void ReceiveingMessagesTest::inspectDebugState(GLboolean expected_state, GLDEBUGPROC expected_callback,
											   GLvoid* expected_user_info) const
{
	GLboolean debug_state = -1;
	m_gl->getBooleanv(GL_DEBUG_OUTPUT, &debug_state);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetBooleanv");

	if (expected_state != debug_state)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "State of DEBUG_OUTPUT: " << debug_state
											<< ", expected " << expected_state << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid state of DEBUG_OUTPUT");
	}

	GLvoid* callback_procedure = 0;
	m_gl->getPointerv(GL_DEBUG_CALLBACK_FUNCTION, &callback_procedure);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetPointerv");

	if (expected_callback != callback_procedure)
	{
		TCU_FAIL("Invalid state of DEBUG_CALLBACK_FUNCTION");
	}

	GLvoid* callback_user_info = 0;
	m_gl->getPointerv(GL_DEBUG_CALLBACK_USER_PARAM, &callback_user_info);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetPointerv");

	if (expected_user_info != callback_user_info)
	{
		TCU_FAIL("Invalid state of DEBUG_CALLBACK_USER_PARAM");
	}
}